

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  long lVar1;
  long *plVar2;
  int *piVar3;
  ulong uVar4;
  int inch;
  int outch;
  Layer *pLVar5;
  size_t *psVar6;
  Mat *in_RSI;
  Mat *in_RDI;
  Option *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  Mat *in_stack_00000018;
  Mat *in_stack_00000020;
  Option *in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000044;
  Mat *in_stack_00000048;
  Mat *in_stack_00000050;
  bool prefer_sgemm_2;
  bool prefer_sgemm_1;
  bool prefer_sgemm;
  int out_elempack;
  int elempack;
  Mat weights_1 [1];
  Option *in_stack_000001c8;
  Mat weights [2];
  ParamDict pd;
  int num_input;
  int kernel_size;
  int in_stack_000003a8;
  int in_stack_000003ac;
  int in_stack_000003b0;
  int in_stack_000003b4;
  Mat *in_stack_000003b8;
  Mat *in_stack_000003c0;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined8 in_stack_fffffffffffffb88;
  undefined8 *puVar7;
  Mat *in_stack_fffffffffffffb98;
  size_t *psVar8;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  bool bVar9;
  Option *in_stack_fffffffffffffbb8;
  Convolution_x86 *in_stack_fffffffffffffbc0;
  void **local_410;
  void **local_3d8;
  Option *in_stack_fffffffffffffc30;
  Mat *in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc44;
  void **local_398;
  void **local_350;
  int local_330;
  int local_32c;
  undefined1 local_328 [16];
  void *local_318;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  int *piVar10;
  int iVar11;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  Mat *in_stack_fffffffffffffd00;
  Mat *in_stack_fffffffffffffd08;
  void *pvStack_2d0;
  undefined1 local_2c8 [16];
  void *local_2b8;
  int *local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  long *local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  undefined8 local_278;
  void *local_270;
  int *local_268;
  undefined8 local_260;
  undefined4 local_258;
  long *local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined8 local_230;
  void *apvStack_228 [3];
  undefined1 local_210 [8];
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  Mat *_kernel;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int iVar12;
  undefined8 in_stack_fffffffffffffe20;
  Mat *in_stack_fffffffffffffe28;
  Mat *in_stack_fffffffffffffe30;
  Option *in_stack_fffffffffffffe48;
  int kernel_h;
  undefined8 in_stack_fffffffffffffe50;
  int kernel_w;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Mat *in_stack_fffffffffffffe68;
  size_t *psVar13;
  Option *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  Mat *in_stack_fffffffffffffe88;
  void **ppvVar14;
  Mat *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  Mat *in_stack_ffffffffffffff20;
  Mat *in_stack_ffffffffffffff28;
  
  iVar12 = (int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  piVar10 = (int *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0);
  if (*(int *)((long)&in_RDI[4].c + *(long *)((long)in_RDI->data + -0x18)) == 0) {
    _kernel = in_RDI;
    pLVar5 = create_activation_layer
                       (in_stack_fffffffffffffc44,in_stack_fffffffffffffc38,
                        in_stack_fffffffffffffc30);
    in_RDI->refcount = (int *)pLVar5;
    if (((in_RSI->field_0x1e & 1) == 0) ||
       (*(long *)((long)&in_RDI[5].refcount + *(long *)((long)in_RDI->data + -0x18)) != 1)) {
      inch = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) *
             *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
      uVar4 = (long)*(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)) /
              (long)inch;
      outch = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                   (long)*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)));
      if (((((ulong)in_RSI->allocator & 0x100000000000000) == 0) &&
          (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
             *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) &&
            (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1)) &&
           (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) ==
            *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4))))) &&
         ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
          (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)))) {
        pLVar5 = create_layer(iVar12);
        in_RDI[5].elemsize = (size_t)pLVar5;
        ParamDict::ParamDict
                  ((ParamDict *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
        ParamDict::set((ParamDict *)local_210,0,
                       *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)));
        ParamDict::set((ParamDict *)local_210,1,
                       *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4))
        ;
        ParamDict::set((ParamDict *)local_210,0xb,
                       *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)));
        ParamDict::set((ParamDict *)local_210,2,1);
        ParamDict::set((ParamDict *)local_210,0xc,1);
        ParamDict::set((ParamDict *)local_210,3,1);
        ParamDict::set((ParamDict *)local_210,0xd,1);
        ParamDict::set((ParamDict *)local_210,4,0);
        ParamDict::set((ParamDict *)local_210,0xe,0);
        ParamDict::set((ParamDict *)local_210,5,
                       *(int *)((long)&in_RDI[3].dims + *(long *)((long)in_RDI->data + -0x18)));
        ParamDict::set((ParamDict *)local_210,6,
                       *(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)));
        (**(code **)(*(long *)in_RDI[5].elemsize + 0x10))((long *)in_RDI[5].elemsize,local_210);
        if (*(int *)((long)&in_RDI[3].dims + *(long *)((long)in_RDI->data + -0x18)) == 0) {
          local_3d8 = &local_318;
          do {
            *local_3d8 = (void *)0x0;
            local_3d8[1] = (void *)0x0;
            local_3d8[2] = (void *)0x0;
            *(undefined4 *)(local_3d8 + 3) = 0;
            local_3d8[4] = (void *)0x0;
            *(undefined4 *)(local_3d8 + 5) = 0;
            *(undefined4 *)((long)local_3d8 + 0x2c) = 0;
            *(undefined4 *)(local_3d8 + 6) = 0;
            *(undefined4 *)((long)local_3d8 + 0x34) = 0;
            *(undefined4 *)(local_3d8 + 7) = 0;
            local_3d8[8] = (void *)0x0;
            local_3d8 = local_3d8 + 9;
          } while (local_3d8 != &pvStack_2d0);
          lVar1 = *(long *)((long)in_RDI->data + -0x18);
          ppvVar14 = (void **)((long)&in_RDI[4].cstep + lVar1);
          if (&local_318 != ppvVar14) {
            if (*(long *)((long)&in_RDI[5].data + lVar1) != 0) {
              piVar3 = *(int **)((long)&in_RDI[5].data + lVar1);
              LOCK();
              *piVar3 = *piVar3 + 1;
              UNLOCK();
            }
            if (piVar10 != (int *)0x0) {
              LOCK();
              iVar12 = *piVar10;
              *piVar10 = *piVar10 + -1;
              UNLOCK();
              if (iVar12 == 1) {
                if (in_stack_fffffffffffffd08 == (Mat *)0x0) {
                  if (local_318 != (void *)0x0) {
                    free(local_318);
                  }
                }
                else {
                  (**(code **)((long)in_stack_fffffffffffffd08->data + 0x18))
                            (in_stack_fffffffffffffd08,local_318);
                }
              }
            }
            local_318 = *ppvVar14;
          }
          plVar2 = (long *)in_RDI[5].elemsize;
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                     in_stack_fffffffffffffb98);
          (**(code **)(*plVar2 + 0x18))(plVar2,local_328);
          ModelBinFromMatArray::~ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_410 = &pvStack_2d0;
          do {
            ppvVar14 = local_410 + -9;
            if (local_410[-8] != (void *)0x0) {
              piVar10 = (int *)local_410[-8];
              LOCK();
              iVar12 = *piVar10;
              *piVar10 = *piVar10 + -1;
              UNLOCK();
              if (iVar12 == 1) {
                if (local_410[-5] == (void *)0x0) {
                  if (*ppvVar14 != (void *)0x0) {
                    free(*ppvVar14);
                  }
                }
                else {
                  (**(code **)(*local_410[-5] + 0x18))(local_410[-5],*ppvVar14);
                }
              }
            }
            *ppvVar14 = (void *)0x0;
            local_410[-7] = (void *)0x0;
            *(undefined4 *)(local_410 + -6) = 0;
            *(undefined4 *)(local_410 + -4) = 0;
            *(undefined4 *)((long)local_410 + -0x1c) = 0;
            *(undefined4 *)(local_410 + -3) = 0;
            *(undefined4 *)((long)local_410 + -0x14) = 0;
            *(undefined4 *)(local_410 + -2) = 0;
            local_410[-1] = (void *)0x0;
            local_410[-8] = (void *)0x0;
            local_410 = ppvVar14;
          } while (ppvVar14 != &local_318);
        }
        else {
          local_350 = &local_2b8;
          do {
            *local_350 = (void *)0x0;
            local_350[1] = (void *)0x0;
            local_350[2] = (void *)0x0;
            *(undefined4 *)(local_350 + 3) = 0;
            local_350[4] = (void *)0x0;
            *(undefined4 *)(local_350 + 5) = 0;
            *(undefined4 *)((long)local_350 + 0x2c) = 0;
            *(undefined4 *)(local_350 + 6) = 0;
            *(undefined4 *)((long)local_350 + 0x34) = 0;
            *(undefined4 *)(local_350 + 7) = 0;
            local_350[8] = (void *)0x0;
            local_350 = local_350 + 9;
          } while (local_350 != apvStack_228);
          lVar1 = *(long *)((long)in_RDI->data + -0x18);
          ppvVar14 = (void **)((long)&in_RDI[4].cstep + lVar1);
          if (&local_2b8 != ppvVar14) {
            if (*(long *)((long)&in_RDI[5].data + lVar1) != 0) {
              piVar10 = *(int **)((long)&in_RDI[5].data + lVar1);
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
            if (local_2b0 != (int *)0x0) {
              LOCK();
              iVar12 = *local_2b0;
              *local_2b0 = *local_2b0 + -1;
              UNLOCK();
              if (iVar12 == 1) {
                if (local_298 == (long *)0x0) {
                  if (local_2b8 != (void *)0x0) {
                    free(local_2b8);
                  }
                }
                else {
                  (**(code **)(*local_298 + 0x18))(local_298,local_2b8);
                }
              }
            }
            local_2b8 = *ppvVar14;
            local_2b0 = *(int **)((long)&in_RDI[5].data + lVar1);
            local_2a8 = *(undefined8 *)((long)&in_RDI[5].refcount + lVar1);
            local_2a0 = *(undefined4 *)((long)&in_RDI[5].elemsize + lVar1);
            local_298 = *(long **)((long)&in_RDI[5].elempack + lVar1);
            local_290 = *(undefined4 *)((long)&in_RDI[5].allocator + lVar1);
            local_28c = *(undefined4 *)((long)&in_RDI[5].allocator + lVar1 + 4);
            local_288 = *(undefined4 *)((long)&in_RDI[5].dims + lVar1);
            local_284 = *(undefined4 *)((long)&in_RDI[5].w + lVar1);
            local_280 = *(undefined4 *)((long)&in_RDI[5].h + lVar1);
            local_278 = *(undefined8 *)((long)&in_RDI[5].c + lVar1);
          }
          lVar1 = *(long *)((long)in_RDI->data + -0x18);
          ppvVar14 = (void **)((long)&in_RDI[5].cstep + lVar1);
          if (&local_270 != ppvVar14) {
            if (*(long *)((long)&in_RDI[6].data + lVar1) != 0) {
              piVar10 = *(int **)((long)&in_RDI[6].data + lVar1);
              LOCK();
              *piVar10 = *piVar10 + 1;
              UNLOCK();
            }
            if (local_268 != (int *)0x0) {
              LOCK();
              iVar12 = *local_268;
              *local_268 = *local_268 + -1;
              UNLOCK();
              if (iVar12 == 1) {
                if (local_250 == (long *)0x0) {
                  if (local_270 != (void *)0x0) {
                    free(local_270);
                  }
                }
                else {
                  (**(code **)(*local_250 + 0x18))(local_250,local_270);
                }
              }
            }
            local_270 = *ppvVar14;
            local_268 = *(int **)((long)&in_RDI[6].data + lVar1);
            local_260 = *(undefined8 *)((long)&in_RDI[6].refcount + lVar1);
            local_258 = *(undefined4 *)((long)&in_RDI[6].elemsize + lVar1);
            local_250 = *(long **)((long)&in_RDI[6].elempack + lVar1);
            local_248 = *(undefined4 *)((long)&in_RDI[6].allocator + lVar1);
            local_244 = *(undefined4 *)((long)&in_RDI[6].allocator + lVar1 + 4);
            local_240 = *(undefined4 *)((long)&in_RDI[6].dims + lVar1);
            local_23c = *(undefined4 *)((long)&in_RDI[6].w + lVar1);
            local_238 = *(undefined4 *)((long)&in_RDI[6].h + lVar1);
            local_230 = *(undefined8 *)((long)&in_RDI[6].c + lVar1);
          }
          plVar2 = (long *)in_RDI[5].elemsize;
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                     in_stack_fffffffffffffb98);
          (**(code **)(*plVar2 + 0x18))(plVar2,local_2c8);
          ModelBinFromMatArray::~ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
          local_398 = apvStack_228;
          do {
            ppvVar14 = local_398 + -9;
            if (local_398[-8] != (void *)0x0) {
              piVar10 = (int *)local_398[-8];
              LOCK();
              iVar12 = *piVar10;
              *piVar10 = *piVar10 + -1;
              UNLOCK();
              if (iVar12 == 1) {
                if (local_398[-5] == (void *)0x0) {
                  if (*ppvVar14 != (void *)0x0) {
                    free(*ppvVar14);
                  }
                }
                else {
                  (**(code **)(*local_398[-5] + 0x18))(local_398[-5],*ppvVar14);
                }
              }
            }
            *ppvVar14 = (void *)0x0;
            local_398[-7] = (void *)0x0;
            *(undefined4 *)(local_398 + -6) = 0;
            *(undefined4 *)(local_398 + -4) = 0;
            *(undefined4 *)((long)local_398 + -0x1c) = 0;
            *(undefined4 *)(local_398 + -3) = 0;
            *(undefined4 *)((long)local_398 + -0x14) = 0;
            *(undefined4 *)(local_398 + -2) = 0;
            local_398[-1] = (void *)0x0;
            local_398[-8] = (void *)0x0;
            local_398 = ppvVar14;
          } while (ppvVar14 != &local_2b8);
        }
        (**(code **)(*(long *)in_RDI[5].elemsize + 0x20))((long *)in_RDI[5].elemsize,in_RSI);
        if (((ulong)in_RSI->data & 1) != 0) {
          lVar1 = *(long *)((long)in_RDI->data + -0x18);
          puVar7 = (undefined8 *)((long)&in_RDI[4].cstep + lVar1);
          if (*(long *)((long)&in_RDI[5].data + lVar1) != 0) {
            piVar10 = *(int **)((long)&in_RDI[5].data + lVar1);
            LOCK();
            iVar12 = *piVar10;
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (iVar12 == 1) {
              if (*(long *)((long)&in_RDI[5].elempack + lVar1) == 0) {
                if ((void *)*puVar7 != (void *)0x0) {
                  free((void *)*puVar7);
                }
              }
              else {
                plVar2 = *(long **)((long)&in_RDI[5].elempack + lVar1);
                (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
              }
            }
          }
          *puVar7 = 0;
          *(undefined8 *)((long)&in_RDI[5].refcount + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].elemsize + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].allocator + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].allocator + lVar1 + 4) = 0;
          *(undefined4 *)((long)&in_RDI[5].dims + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].w + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].h + lVar1) = 0;
          *(undefined8 *)((long)&in_RDI[5].c + lVar1) = 0;
          *(undefined8 *)((long)&in_RDI[5].data + lVar1) = 0;
        }
        iVar12 = 0;
        ParamDict::~ParamDict
                  ((ParamDict *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      }
      else {
        local_32c = 1;
        local_330 = 1;
        if (((ulong)in_RSI->allocator & 0x100000000000000) != 0) {
          local_32c = 1;
          if (outch % 4 == 0) {
            local_32c = 4;
          }
          local_330 = 1;
          if (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) % 4 == 0) {
            local_330 = 4;
          }
        }
        if ((local_32c == 4) && (local_330 == 4)) {
          iVar12 = (int)in_stack_ffffffffffffff18;
          iVar11 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
          if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)
              && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                   (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
                   )) && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)
                                  ) == 1)))) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
              && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1))
             )) {
            convolution_im2col_sgemm_transform_kernel_pack4_sse
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,iVar11,iVar12,
                       in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
          }
          else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                    1) && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))
                             == 1 && (*(int *)((long)&in_RDI[3].data +
                                              *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
                           ((*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                            ((*(int *)((long)&in_RDI[3].refcount +
                                      *(long *)((long)in_RDI->data + -0x18) + 4) == 2 &&
                             (*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack4_sse
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,iVar11,iVar12,
                       in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
          }
          else if ((((in_RSI->field_0x1c & 1) == 0) ||
                   ((((((in_RSI->d & 0x1000000) == 0 && ((in_RSI->c & 1) == 0)) &&
                      ((in_RSI->c & 0x100) == 0)) ||
                     ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4)
                       != 3 || (*(int *)((long)&in_RDI[3].data +
                                        *(long *)((long)in_RDI->data + -0x18)) != 3)))) ||
                    ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) !=
                      1 || ((*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18)) != 1 ||
                            (*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18) + 4) != 1)))))))) ||
                  (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) != 1)
                  ) {
            if ((((((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) !=
                     1) || (*(int *)((long)&in_RDI[3].refcount +
                                    *(long *)((long)in_RDI->data + -0x18)) != 1)) ||
                  (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4)
                   != 1)) ||
                 ((*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) != 1
                  || ((bVar9 = true, outch < 0xc &&
                      (bVar9 = true,
                      *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 0xc
                      )))))) &&
                (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1
                  || ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18))
                       != 1 || ((*(int *)((long)&in_RDI[3].refcount +
                                         *(long *)((long)in_RDI->data + -0x18) + 4) < 2 &&
                                (*(int *)((long)&in_RDI[3].elemsize +
                                         *(long *)((long)in_RDI->data + -0x18)) < 2)))))) ||
                 ((bVar9 = true, outch < 0x10 &&
                  (bVar9 = true,
                  *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 0x10)))
                 ))) && (((1 < *(int *)((long)&in_RDI[3].data +
                                       *(long *)((long)in_RDI->data + -0x18) + 4) ||
                          (bVar9 = false,
                          1 < *(int *)((long)&in_RDI[3].refcount +
                                      *(long *)((long)in_RDI->data + -0x18)))) &&
                         (bVar9 = true, outch < 0x10)))) {
              bVar9 = 0xf < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18))
              ;
            }
            if (((in_RSI->field_0x1d & 1) == 0) || (!bVar9)) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                         in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,
                         (int)((ulong)piVar10 >> 0x20),(int)piVar10,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffed8);
            }
            else {
              convolution_im2col_sgemm_transform_kernel_pack4_sse
                        (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,iVar11,iVar12,
                         in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
            }
          }
          else if (((((in_RSI->c & 0x100) == 0) || (outch < 8)) ||
                   ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 8 ||
                    ((0x20 < outch ||
                     (0x20 < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)
                                     ))))))) &&
                  (((in_RSI->c & 1) != 0 || ((in_RSI->d & 0x1000000) != 0)))) {
            if (((((in_RSI->c & 1) == 0) || (outch < 8)) ||
                (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 8)) &&
               (((in_RSI->c & 0x100) != 0 || ((in_RSI->d & 0x1000000) != 0)))) {
              conv3x3s1_winograd23_transform_kernel_pack4_sse
                        (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                         (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                         (int)in_stack_fffffffffffffe20,
                         (Option *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            }
            else {
              conv3x3s1_winograd43_transform_kernel_pack4_sse
                        ((Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         (Mat *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                         (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                         (int)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            }
          }
          else {
            conv3x3s1_winograd63_transform_kernel_pack4_sse
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84
                       ,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          }
        }
        iVar11 = (int)((ulong)piVar10 >> 0x20);
        iVar12 = (int)piVar10;
        if ((local_32c == 1) && (local_330 == 4)) {
          kernel_h = (int)in_stack_fffffffffffffe50;
          kernel_w = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
          if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)
              && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                   (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
                   )) && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)
                                  ) == 1)))) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
              && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1))
             )) {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                      (in_stack_fffffffffffffe68,
                       (Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,kernel_w,kernel_h);
          }
          else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                    1) && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))
                             == 1 && (*(int *)((long)&in_RDI[3].data +
                                              *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
                           ((*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                            ((*(int *)((long)&in_RDI[3].refcount +
                                      *(long *)((long)in_RDI->data + -0x18) + 4) == 2 &&
                             (*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                      (in_stack_fffffffffffffe68,
                       (Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,kernel_w,kernel_h);
          }
          else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                    3) && ((((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)
                                      ) == 3 &&
                             (*(int *)((long)&in_RDI[3].data +
                                      *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
                            (*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18)) == 1)) &&
                           ((*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18) + 4) == 1 &&
                            (*(int *)((long)&in_RDI[3].elemsize +
                                     *(long *)((long)in_RDI->data + -0x18)) == 1)))))) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc
                       ,in_stack_fffffffffffffcf8,iVar11,iVar12,in_stack_fffffffffffffed0,
                       in_stack_fffffffffffffed8);
          }
          else if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                     3) && ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))
                             == 3 && (*(int *)((long)&in_RDI[3].data +
                                              *(long *)((long)in_RDI->data + -0x18) + 4) == 1)))) &&
                  ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1
                   && ((*(int *)((long)&in_RDI[3].refcount +
                                *(long *)((long)in_RDI->data + -0x18) + 4) == 2 &&
                       (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18))
                        == 2)))))) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc
                       ,in_stack_fffffffffffffcf8,iVar11,iVar12,in_stack_fffffffffffffed0,
                       in_stack_fffffffffffffed8);
          }
          else {
            if (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1)
                || ((((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18))
                       != 1 || (*(int *)((long)&in_RDI[3].refcount +
                                        *(long *)((long)in_RDI->data + -0x18) + 4) != 1)) ||
                     (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) !=
                      1)) || ((bVar9 = true, outch < 0xc &&
                              (bVar9 = true,
                              *(int *)((long)&in_RDI[2].cstep +
                                      *(long *)((long)in_RDI->data + -0x18)) < 0xc)))))) &&
               (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1
                 || (((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18))
                       != 1 || ((*(int *)((long)&in_RDI[3].refcount +
                                         *(long *)((long)in_RDI->data + -0x18) + 4) < 2 &&
                                (*(int *)((long)&in_RDI[3].elemsize +
                                         *(long *)((long)in_RDI->data + -0x18)) < 2)))) ||
                     ((bVar9 = true, outch < 0x10 &&
                      (bVar9 = true,
                      *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) <
                      0x10)))))) &&
                (((1 < *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4)
                  || (bVar9 = false,
                     1 < *(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18))
                     )) && (bVar9 = true, outch < 0x10)))))) {
              bVar9 = 0xf < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18))
              ;
            }
            if (((in_RSI->field_0x1d & 1) == 0) || (!bVar9)) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                         in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,iVar11,iVar12,
                         in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
            }
            else {
              convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                        (in_stack_fffffffffffffe68,
                         (Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,kernel_w,kernel_h);
            }
          }
        }
        if ((local_32c == 4) && (local_330 == 1)) {
          if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)
              && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                   (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
                   )) && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)
                                  ) == 1)))) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
              && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1))
             )) {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                      (_kernel,in_RSI,inch,outch,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8
                      );
          }
          else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                    1) && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))
                             == 1 && (*(int *)((long)&in_RDI[3].data +
                                              *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
                           ((*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                            ((*(int *)((long)&in_RDI[3].refcount +
                                      *(long *)((long)in_RDI->data + -0x18) + 4) == 2 &&
                             (*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                      (_kernel,in_RSI,inch,outch,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8
                      );
          }
          else if (((in_RSI->field_0x1c & 1) == 0) ||
                  (((((((in_RSI->c & 0x100) == 0 ||
                       (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4)
                        != 3)) ||
                      (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3)
                      ) || ((*(int *)((long)&in_RDI[3].data +
                                     *(long *)((long)in_RDI->data + -0x18) + 4) != 1 ||
                            (*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18)) != 1)))) ||
                    (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4)
                     != 1)) ||
                   (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) != 1
                   )))) {
            if ((((((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) !=
                     1) || (*(int *)((long)&in_RDI[3].refcount +
                                    *(long *)((long)in_RDI->data + -0x18)) != 1)) ||
                  ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4)
                    != 1 || (*(int *)((long)&in_RDI[3].elemsize +
                                     *(long *)((long)in_RDI->data + -0x18)) != 1)))) ||
                 ((bVar9 = true, outch < 0xc &&
                  (bVar9 = true,
                  *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 0xc))))
                && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) !=
                      1 || ((*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18)) != 1 ||
                            ((*(int *)((long)&in_RDI[3].refcount +
                                      *(long *)((long)in_RDI->data + -0x18) + 4) < 2 &&
                             (*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) < 2)))))) ||
                    ((bVar9 = true, outch < 0x10 &&
                     (bVar9 = true,
                     *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 0x10
                     )))))) &&
               (((1 < *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) ||
                 (bVar9 = false,
                 1 < *(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18))))
                && (bVar9 = true, outch < 0x10)))) {
              bVar9 = 0xf < *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18))
              ;
            }
            if (((in_RSI->field_0x1d & 1) == 0) || (!bVar9)) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                         in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,
                         (int)((ulong)piVar10 >> 0x20),(int)piVar10,in_stack_fffffffffffffed0,
                         in_stack_fffffffffffffed8);
            }
            else {
              convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                        (_kernel,in_RSI,inch,outch,in_stack_fffffffffffffdfc,
                         in_stack_fffffffffffffdf8);
            }
          }
          else {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse
                      ((Mat *)weights[0].elemsize,(Mat *)weights[0].refcount,weights[0].data._4_4_,
                       (int)weights[0].data,in_stack_000001c8);
          }
        }
        if ((local_32c == 1) && (local_330 == 1)) {
          if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)
              && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                   (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
                   )) && (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)
                                  ) == 1)))) &&
             ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
              && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1))
             )) {
            convolution_im2col_sgemm_transform_kernel_sse
                      (in_stack_000003c0,in_stack_000003b8,in_stack_000003b4,in_stack_000003b0,
                       in_stack_000003ac,in_stack_000003a8);
          }
          else if ((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                    1) && (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))
                             == 1 && (*(int *)((long)&in_RDI[3].data +
                                              *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
                           ((*(int *)((long)&in_RDI[3].refcount +
                                     *(long *)((long)in_RDI->data + -0x18)) == 1 &&
                            ((*(int *)((long)&in_RDI[3].refcount +
                                      *(long *)((long)in_RDI->data + -0x18) + 4) == 2 &&
                             (*(int *)((long)&in_RDI[3].elemsize +
                                      *(long *)((long)in_RDI->data + -0x18)) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_sse
                      (in_stack_000003c0,in_stack_000003b8,in_stack_000003b4,in_stack_000003b0,
                       in_stack_000003ac,in_stack_000003a8);
          }
          else if (((in_RSI->field_0x1c & 1) == 0) ||
                  ((((((in_RSI->d & 0x1000000) == 0 && ((in_RSI->c & 1) == 0)) ||
                     (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4)
                      != 3)) ||
                    ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3
                     || (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4)
                         != 1)))) ||
                   ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) !=
                     1 || ((*(int *)((long)&in_RDI[3].refcount +
                                    *(long *)((long)in_RDI->data + -0x18) + 4) != 1 ||
                           (*(int *)((long)&in_RDI[3].elemsize +
                                    *(long *)((long)in_RDI->data + -0x18)) != 1)))))))) {
            if ((in_RSI->field_0x1d & 1) == 0) {
              lVar1 = *(long *)((long)in_RDI->data + -0x18);
              psVar13 = (size_t *)((long)&in_RDI[4].cstep + lVar1);
              psVar6 = &in_RDI->elemsize;
              if (psVar6 != psVar13) {
                if (*(long *)((long)&in_RDI[5].data + lVar1) != 0) {
                  piVar10 = *(int **)((long)&in_RDI[5].data + lVar1);
                  LOCK();
                  *piVar10 = *piVar10 + 1;
                  UNLOCK();
                }
                psVar8 = psVar6;
                if (*(long *)&in_RDI->elempack != 0) {
                  piVar10 = *(int **)&in_RDI->elempack;
                  LOCK();
                  iVar12 = *piVar10;
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (iVar12 == 1) {
                    lVar1._0_4_ = in_RDI->h;
                    lVar1._4_4_ = in_RDI->d;
                    if (lVar1 == 0) {
                      if ((void *)*psVar6 != (void *)0x0) {
                        free((void *)*psVar6);
                      }
                    }
                    else {
                      (**(code **)(**(long **)&in_RDI->h + 0x18))(*(long **)&in_RDI->h,*psVar6);
                    }
                  }
                }
                *psVar6 = 0;
                in_RDI->allocator = (Allocator *)0x0;
                in_RDI->dims = 0;
                in_RDI->c = 0;
                *(undefined4 *)&in_RDI->field_0x3c = 0;
                *(undefined4 *)&in_RDI->cstep = 0;
                *(undefined4 *)((long)&in_RDI->cstep + 4) = 0;
                *(undefined4 *)&in_RDI[1].data = 0;
                in_RDI[1].refcount = (int *)0x0;
                *(undefined8 *)&in_RDI->elempack = 0;
                *psVar8 = *psVar13;
                psVar8[1] = psVar13[1];
                psVar8[2] = (size_t)psVar13[2];
                *(int *)(psVar8 + 3) = (int)psVar13[3];
                psVar8[4] = psVar13[4];
                *(int *)(psVar8 + 5) = (int)psVar13[5];
                *(undefined4 *)((long)psVar8 + 0x2c) = *(undefined4 *)((long)psVar13 + 0x2c);
                *(int *)(psVar8 + 6) = (int)psVar13[6];
                *(undefined4 *)((long)psVar8 + 0x34) = *(undefined4 *)((long)psVar13 + 0x34);
                *(int *)(psVar8 + 7) = (int)psVar13[7];
                psVar8[8] = psVar13[8];
              }
            }
            else {
              convolution_im2col_sgemm_transform_kernel_sse
                        (in_stack_000003c0,in_stack_000003b8,in_stack_000003b4,in_stack_000003b0,
                         in_stack_000003ac,in_stack_000003a8);
            }
          }
          else if (((((in_RSI->c & 1) == 0) || (outch < 0x10)) ||
                   (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 0x10)
                   ) && ((in_RSI->d & 0x1000000) != 0)) {
            conv3x3s1_winograd23_transform_kernel_sse
                      (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000010,
                       in_stack_00000008);
          }
          else {
            conv3x3s1_winograd43_transform_kernel_sse
                      (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
                       in_stack_00000038);
          }
        }
        if (((ulong)in_RSI->data & 1) != 0) {
          lVar1 = *(long *)((long)in_RDI->data + -0x18);
          puVar7 = (undefined8 *)((long)&in_RDI[4].cstep + lVar1);
          if (*(long *)((long)&in_RDI[5].data + lVar1) != 0) {
            piVar10 = *(int **)((long)&in_RDI[5].data + lVar1);
            LOCK();
            iVar12 = *piVar10;
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (iVar12 == 1) {
              if (*(long *)((long)&in_RDI[5].elempack + lVar1) == 0) {
                if ((void *)*puVar7 != (void *)0x0) {
                  free((void *)*puVar7);
                }
              }
              else {
                plVar2 = *(long **)((long)&in_RDI[5].elempack + lVar1);
                (**(code **)(*plVar2 + 0x18))(plVar2,*puVar7);
              }
            }
          }
          *puVar7 = 0;
          puVar7[2] = 0;
          *(undefined4 *)(puVar7 + 3) = 0;
          *(undefined4 *)(puVar7 + 5) = 0;
          *(undefined4 *)((long)puVar7 + 0x2c) = 0;
          *(undefined4 *)(puVar7 + 6) = 0;
          *(undefined4 *)((long)puVar7 + 0x34) = 0;
          *(undefined4 *)(puVar7 + 7) = 0;
          puVar7[8] = 0;
          puVar7[1] = 0;
        }
        iVar12 = 0;
      }
    }
    else {
      iVar12 = create_pipeline_int8_x86(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    }
  }
  else {
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}